

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  p_ply_element_conflict element_00;
  p_ply_property_conflict ptVar1;
  p_ply_property_conflict property;
  p_ply_element_conflict element;
  long idata_local;
  void *pdata_local;
  p_ply_read_cb read_cb_local;
  char *property_name_local;
  char *element_name_local;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (element_name != (char *)0x0)) && (property_name != (char *)0x0)) {
    element_00 = ply_find_element(ply,element_name);
    if (element_00 == (p_ply_element_conflict)0x0) {
      ply_local = (p_ply)0x0;
    }
    else {
      ptVar1 = ply_find_property(element_00,property_name);
      if (ptVar1 == (p_ply_property_conflict)0x0) {
        ply_local = (p_ply)0x0;
      }
      else {
        ptVar1->read_cb = read_cb;
        ptVar1->pdata = pdata;
        ptVar1->idata = idata;
        ply_local = (p_ply)(long)(int)element_00->ninstances;
      }
    }
    return (long)ply_local;
  }
  __assert_fail("ply && element_name && property_name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x1b1,
                "long ply_set_read_cb(p_ply, const char *, const char *, p_ply_read_cb, void *, long)"
               );
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
        const char* property_name, p_ply_read_cb read_cb,
        void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int) element->ninstances;
}